

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkCheckConvergence(ARKodeMem ark_mem,int *nflagPtr,int *ncfPtr)

{
  int iVar1;
  ARKodeHAdaptMem pAVar2;
  int iVar3;
  
  iVar1 = *nflagPtr;
  iVar3 = iVar1;
  if ((iVar1 != 0) && (iVar1 != 0xb)) {
    ark_mem->ncfn = ark_mem->ncfn + 1;
    iVar3 = -4;
    if (ark_mem->fixedstep == 0) {
      pAVar2 = ark_mem->hadapt_mem;
      if (pAVar2 == (ARKodeHAdaptMem)0x0) {
        arkProcessError(ark_mem,-0x15,0xc9a,"arkCheckConvergence",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                        ,"Adaptivity memory structure not allocated.");
        iVar3 = -0x15;
      }
      else if (iVar1 < 0) {
        iVar3 = -0x20;
        if (iVar1 + 8U < 3) {
          iVar3 = iVar1;
        }
      }
      else {
        iVar1 = *ncfPtr;
        *ncfPtr = iVar1 + 1;
        pAVar2->etamax = 1.0;
        if ((iVar1 + 1 == ark_mem->maxncf) || (ABS(ark_mem->h) <= ark_mem->hmin * 1.000001)) {
          if (*nflagPtr == 4) {
            return -4;
          }
          if (*nflagPtr == 9) {
            return -10;
          }
        }
        ark_mem->eta = pAVar2->etacf;
        *nflagPtr = 7;
        iVar3 = 3;
      }
    }
  }
  return iVar3;
}

Assistant:

int arkCheckConvergence(ARKodeMem ark_mem, int* nflagPtr, int* ncfPtr)
{
  ARKodeHAdaptMem hadapt_mem;

  /* If nonlinear solver succeeded, return with ARK_SUCCESS */
  if (*nflagPtr == ARK_SUCCESS) { return (ARK_SUCCESS); }
  /* Returns with an ARK_RETRY_STEP flag occur at a stage well before
  any algebraic solvers are involved. On the other hand,
  the arkCheckConvergence function handles the results from algebraic
  solvers, which never take place with an ARK_RETRY_STEP flag.
  Therefore, we immediately return from arkCheckConvergence,
  as it is irrelevant in the case of an ARK_RETRY_STEP */
  if (*nflagPtr == ARK_RETRY_STEP) { return (ARK_RETRY_STEP); }

  /* The nonlinear soln. failed; increment ncfn */
  ark_mem->ncfn++;

  /* If fixed time stepping, then return with convergence failure */
  if (ark_mem->fixedstep) { return (ARK_CONV_FAILURE); }

  /* Otherwise, access adaptivity structure */
  if (ark_mem->hadapt_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKADAPT_NO_MEM);
    return (ARK_MEM_NULL);
  }
  hadapt_mem = ark_mem->hadapt_mem;

  /* Return if lsetup, lsolve, or rhs failed unrecoverably */
  if (*nflagPtr < 0)
  {
    if (*nflagPtr == ARK_LSETUP_FAIL) { return (ARK_LSETUP_FAIL); }
    else if (*nflagPtr == ARK_LSOLVE_FAIL) { return (ARK_LSOLVE_FAIL); }
    else if (*nflagPtr == ARK_RHSFUNC_FAIL) { return (ARK_RHSFUNC_FAIL); }
    else { return (ARK_NLS_OP_ERR); }
  }

  /* At this point, nflag = CONV_FAIL or RHSFUNC_RECVR; increment ncf */
  (*ncfPtr)++;
  hadapt_mem->etamax = ONE;

  /* If we had maxncf failures, or if |h| = hmin,
     return ARK_CONV_FAILURE or ARK_REPTD_RHSFUNC_ERR. */
  if ((*ncfPtr == ark_mem->maxncf) ||
      (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM))
  {
    if (*nflagPtr == CONV_FAIL) { return (ARK_CONV_FAILURE); }
    if (*nflagPtr == RHSFUNC_RECVR) { return (ARK_REPTD_RHSFUNC_ERR); }
  }

  /* Reduce step size due to convergence failure */
  ark_mem->eta = hadapt_mem->etacf;

  /* Signal for Jacobian/preconditioner setup */
  *nflagPtr = PREV_CONV_FAIL;

  /* Return to reattempt the step */
  return (PREDICT_AGAIN);
}